

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# icosahedralBuilderCmd.cpp
# Opt level: O3

int cmdline_parser2(int argc,char **argv,gengetopt_args_info *args_info,int override,int initialize,
                   int check_required)

{
  int iVar1;
  undefined4 in_register_00000084;
  cmdline_parser_params params;
  cmdline_parser_params local_14;
  
  local_14.check_ambiguity = 0;
  local_14.print_errors = 1;
  local_14.override = override;
  local_14.initialize = initialize;
  local_14.check_required = check_required;
  iVar1 = cmdline_parser_internal
                    (argc,argv,args_info,&local_14,(char *)CONCAT44(in_register_00000084,initialize)
                    );
  return iVar1;
}

Assistant:

int
cmdline_parser2 (int argc, char **argv, struct gengetopt_args_info *args_info, int override, int initialize, int check_required)
{
  int result;
  struct cmdline_parser_params params;
  
  params.override = override;
  params.initialize = initialize;
  params.check_required = check_required;
  params.check_ambiguity = 0;
  params.print_errors = 1;

  result = cmdline_parser_internal (argc, argv, args_info, &params, 0);

  return result;
}